

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

Opnd * __thiscall IR::Opnd::Copy(Opnd *this,Func *func)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Func *func_local;
  Opnd *this_local;
  
  switch(this->m_kind) {
  case OpndKindIntConst:
    this_local = &IntConstOpnd::CopyInternal((IntConstOpnd *)this,func)->super_Opnd;
    break;
  case OpndKindInt64Const:
    this_local = &Int64ConstOpnd::CopyInternal((Int64ConstOpnd *)this,func)->super_Opnd;
    break;
  case OpndKindFloatConst:
    this_local = &FloatConstOpnd::CopyInternal((FloatConstOpnd *)this,func)->super_Opnd;
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x19f,"((0))","UNREACHED");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  case OpndKindHelperCall:
    bVar2 = HelperCallOpnd::IsDiagHelperCallOpnd((HelperCallOpnd *)this);
    if (bVar2) {
      this_local = (Opnd *)DiagHelperCallOpnd::CopyInternalSub((DiagHelperCallOpnd *)this,func);
    }
    else {
      this_local = &HelperCallOpnd::CopyInternal((HelperCallOpnd *)this,func)->super_Opnd;
    }
    break;
  case OpndKindSym:
    bVar2 = SymOpnd::IsPropertySymOpnd((SymOpnd *)this);
    if (bVar2) {
      this_local = (Opnd *)PropertySymOpnd::CopyInternalSub((PropertySymOpnd *)this,func);
    }
    else {
      this_local = &SymOpnd::CopyInternal((SymOpnd *)this,func)->super_Opnd;
    }
    break;
  case OpndKindReg:
    bVar2 = RegOpnd::IsArrayRegOpnd((RegOpnd *)this);
    if (bVar2) {
      this_local = (Opnd *)ArrayRegOpnd::CopyInternalSub((ArrayRegOpnd *)this,func);
    }
    else {
      this_local = &RegOpnd::CopyInternal((RegOpnd *)this,func)->super_Opnd;
    }
    break;
  case OpndKindAddr:
    this_local = &AddrOpnd::CopyInternal((AddrOpnd *)this,func)->super_Opnd;
    break;
  case OpndKindIndir:
    this_local = &IndirOpnd::CopyInternal((IndirOpnd *)this,func)->super_Opnd;
    break;
  case OpndKindLabel:
    this_local = &LabelOpnd::CopyInternal((LabelOpnd *)this,func)->super_Opnd;
    break;
  case OpndKindMemRef:
    this_local = &MemRefOpnd::CopyInternal((MemRefOpnd *)this,func)->super_Opnd;
    break;
  case OpndKindRegBV:
    this_local = &RegBVOpnd::CopyInternal((RegBVOpnd *)this,func)->super_Opnd;
    break;
  case OpndKindList:
    this_local = ListOpnd::CopyInternal((ListOpnd *)this,func);
  }
  return this_local;
}

Assistant:

Opnd * Opnd::Copy(Func *func)
{
    switch (this->m_kind)
    {
    case OpndKindIntConst:
        return static_cast<IntConstOpnd*>(this)->CopyInternal(func);

    case OpndKindInt64Const:
        return static_cast<Int64ConstOpnd*>(this)->CopyInternal(func);

    case OpndKindFloatConst:
        return static_cast<FloatConstOpnd*>(this)->CopyInternal(func);

    case OpndKindHelperCall:
        if ((*static_cast<HelperCallOpnd*>(this)).IsDiagHelperCallOpnd())
        {
            return static_cast<DiagHelperCallOpnd*>(this)->CopyInternalSub(func);
        }
        return static_cast<HelperCallOpnd*>(this)->CopyInternal(func);

    case OpndKindSym:
        if ((*static_cast<SymOpnd*>(this)).IsPropertySymOpnd())
        {
            return static_cast<PropertySymOpnd*>(this)->CopyInternalSub(func);
        }
        return static_cast<SymOpnd*>(this)->CopyInternal(func);

    case OpndKindReg:
        if ((*static_cast<RegOpnd*>(this)).IsArrayRegOpnd())
        {
            return static_cast<ArrayRegOpnd*>(this)->CopyInternalSub(func);
        }
        return static_cast<RegOpnd*>(this)->CopyInternal(func);

    case OpndKindAddr:
        return static_cast<AddrOpnd*>(this)->CopyInternal(func);

    case OpndKindIndir:
        return static_cast<IndirOpnd*>(this)->CopyInternal(func);

    case OpndKindList:
        return static_cast<ListOpnd*>(this)->CopyInternal(func);

    case OpndKindMemRef:
        return static_cast<MemRefOpnd*>(this)->CopyInternal(func);

    case OpndKindLabel:
        return static_cast<LabelOpnd*>(this)->CopyInternal(func);

    case OpndKindRegBV:
        return static_cast<RegBVOpnd*>(this)->CopyInternal(func);
    default:
        Assert(UNREACHED);
        __assume(UNREACHED);

    };
}